

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O0

bool __thiscall HighsLpMods::isClear(HighsLpMods *this)

{
  size_type sVar1;
  vector<int,_std::allocator<int>_> *in_RDI;
  bool local_1;
  
  sVar1 = std::vector<int,_std::allocator<int>_>::size(in_RDI);
  if (sVar1 == 0) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size(in_RDI + 1);
    if (sVar1 == 0) {
      sVar1 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 2));
      if (sVar1 == 0) {
        sVar1 = std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 3));
        if (sVar1 == 0) {
          sVar1 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::size
                            ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)(in_RDI + 4));
          if (sVar1 == 0) {
            sVar1 = std::vector<double,_std::allocator<double>_>::size
                              ((vector<double,_std::allocator<double>_> *)(in_RDI + 6));
            if (sVar1 == 0) {
              sVar1 = std::vector<double,_std::allocator<double>_>::size
                                ((vector<double,_std::allocator<double>_> *)(in_RDI + 6));
              if (sVar1 == 0) {
                sVar1 = std::vector<int,_std::allocator<int>_>::size(in_RDI + 7);
                if (sVar1 == 0) {
                  sVar1 = std::vector<double,_std::allocator<double>_>::size
                                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 8));
                  if (sVar1 == 0) {
                    local_1 = true;
                  }
                  else {
                    local_1 = false;
                  }
                }
                else {
                  local_1 = false;
                }
              }
              else {
                local_1 = false;
              }
            }
            else {
              local_1 = false;
            }
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool HighsLpMods::isClear() {
  if (this->save_non_semi_variable_index.size()) return false;
  if (this->save_inconsistent_semi_variable_index.size()) return false;
  if (this->save_inconsistent_semi_variable_lower_bound_value.size())
    return false;
  if (this->save_inconsistent_semi_variable_upper_bound_value.size())
    return false;
  if (this->save_inconsistent_semi_variable_type.size()) return false;
  if (this->save_relaxed_semi_variable_lower_bound_value.size()) return false;
  if (this->save_relaxed_semi_variable_lower_bound_value.size()) return false;
  if (this->save_tightened_semi_variable_upper_bound_index.size()) return false;
  if (this->save_tightened_semi_variable_upper_bound_value.size()) return false;
  return true;
}